

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types.cpp
# Opt level: O2

ComponentPtr __thiscall libcellml::AnyCellmlElement::component(AnyCellmlElement *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined8 *in_RSI;
  shared_ptr<libcellml::Component> sVar1;
  ComponentPtr CVar2;
  
  if (*(uint *)*in_RSI < 2) {
    sVar1 = std::any_cast<std::shared_ptr<libcellml::Component>>((any *)this);
    in_RDX = sVar1.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
             _M_pi;
  }
  else {
    this->mPimpl = (AnyCellmlElementImpl *)0x0;
    this[1].mPimpl = (AnyCellmlElementImpl *)0x0;
  }
  CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (ComponentPtr)CVar2.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ComponentPtr AnyCellmlElement::component() const
{
    if ((mPimpl->mType == CellmlElementType::COMPONENT)
        || (mPimpl->mType == CellmlElementType::COMPONENT_REF)) {
        try {
            return std::any_cast<ComponentPtr>(mPimpl->mItem);
        } catch (const std::bad_any_cast &) {
            return nullptr;
        }
    }

    return nullptr;
}